

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cProgramInterfaceQueryTests.cpp
# Opt level: O0

long __thiscall glcts::anon_unknown_0::InvalidValueTest::Run(InvalidValueTest *this)

{
  long lVar1;
  GLuint GVar2;
  char *src_vs;
  char *src_fs;
  GLchar *name_00;
  CallLogWrapper *pCVar3;
  GLenum local_108;
  allocator<char> local_101;
  GLenum prop;
  string str;
  string local_d0 [32];
  string local_b0 [32];
  GLuint local_90;
  GLenum local_8c;
  GLuint program;
  GLenum props [1];
  GLchar name [100];
  GLint local_1c;
  GLsizei len;
  GLint res;
  long error;
  InvalidValueTest *this_local;
  
  _len = 0;
  name[0x60] = '\0';
  name[0x61] = '\0';
  name[0x62] = '\0';
  name[99] = '\0';
  name[0x48] = '\0';
  name[0x49] = '\0';
  name[0x4a] = '\0';
  name[0x4b] = '\0';
  name[0x4c] = '\0';
  name[0x4d] = '\0';
  name[0x4e] = '\0';
  name[0x4f] = '\0';
  name[0x50] = '\0';
  name[0x51] = '\0';
  name[0x52] = '\0';
  name[0x53] = '\0';
  name[0x54] = '\0';
  name[0x55] = '\0';
  name[0x56] = '\0';
  name[0x57] = '\0';
  name[0x38] = '\0';
  name[0x39] = '\0';
  name[0x3a] = '\0';
  name[0x3b] = '\0';
  name[0x3c] = '\0';
  name[0x3d] = '\0';
  name[0x3e] = '\0';
  name[0x3f] = '\0';
  name[0x40] = '\0';
  name[0x41] = '\0';
  name[0x42] = '\0';
  name[0x43] = '\0';
  name[0x44] = '\0';
  name[0x45] = '\0';
  name[0x46] = '\0';
  name[0x47] = '\0';
  name[0x28] = '\0';
  name[0x29] = '\0';
  name[0x2a] = '\0';
  name[0x2b] = '\0';
  name[0x2c] = '\0';
  name[0x2d] = '\0';
  name[0x2e] = '\0';
  name[0x2f] = '\0';
  name[0x30] = '\0';
  name[0x31] = '\0';
  name[0x32] = '\0';
  name[0x33] = '\0';
  name[0x34] = '\0';
  name[0x35] = '\0';
  name[0x36] = '\0';
  name[0x37] = '\0';
  name[0x18] = '\0';
  name[0x19] = '\0';
  name[0x1a] = '\0';
  name[0x1b] = '\0';
  name[0x1c] = '\0';
  name[0x1d] = '\0';
  name[0x1e] = '\0';
  name[0x1f] = '\0';
  name[0x20] = '\0';
  name[0x21] = '\0';
  name[0x22] = '\0';
  name[0x23] = '\0';
  name[0x24] = '\0';
  name[0x25] = '\0';
  name[0x26] = '\0';
  name[0x27] = '\0';
  name[8] = '\0';
  name[9] = '\0';
  name[10] = '\0';
  name[0xb] = '\0';
  name[0xc] = '\0';
  name[0xd] = '\0';
  name[0xe] = '\0';
  name[0xf] = '\0';
  name[0x10] = '\0';
  name[0x11] = '\0';
  name[0x12] = '\0';
  name[0x13] = '\0';
  name[0x14] = '\0';
  name[0x15] = '\0';
  name[0x16] = '\0';
  name[0x17] = '\0';
  _program = 0;
  name[0] = '\0';
  name[1] = '\0';
  name[2] = '\0';
  name[3] = '\0';
  name[4] = '\0';
  name[5] = '\0';
  name[6] = '\0';
  name[7] = '\0';
  name[0x58] = '\0';
  name[0x59] = '\0';
  name[0x5a] = '\0';
  name[0x5b] = '\0';
  local_8c = 0x92f9;
  error = (long)this;
  anon_unknown_0::Output("Case 1: <program> not a name of shader/program object\n");
  pCVar3 = &(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper.
            super_CallLogWrapper;
  glu::CallLogWrapper::glGetProgramInterfaceiv(pCVar3,0x539,0x92e3,0x92f5,&local_1c);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xc]
  )();
  glu::CallLogWrapper::glGetProgramResourceIndex(pCVar3,0x7a69,0x92e3,"pie");
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xc]
  )(this,0x501,&len);
  glu::CallLogWrapper::glGetProgramResourceName
            (pCVar3,0x539,0x92e3,0,0x400,(GLsizei *)(name + 0x60),(GLchar *)&program);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xc]
  )(this,0x501,&len);
  glu::CallLogWrapper::glGetProgramResourceiv
            (pCVar3,0x539,0x92e3,0,1,&local_8c,0x400,(GLsizei *)(name + 0x60),&local_1c);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xc]
  )(this,0x501,&len);
  glu::CallLogWrapper::glGetProgramResourceLocation(pCVar3,0x539,0x92e3,"pie");
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xc]
  )(this,0x501,&len);
  anon_unknown_0::Output("Case 1 finished\n");
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x15])();
  src_vs = (char *)std::__cxx11::string::c_str();
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x16])(local_d0);
  src_fs = (char *)std::__cxx11::string::c_str();
  GVar2 = PIQBase::CreateProgram((PIQBase *)this,src_vs,src_fs,false);
  std::__cxx11::string::~string(local_d0);
  std::__cxx11::string::~string(local_b0);
  pCVar3 = &(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper.
            super_CallLogWrapper;
  local_90 = GVar2;
  glu::CallLogWrapper::glBindAttribLocation(pCVar3,GVar2,0,"position");
  PIQBase::LinkProgram((PIQBase *)this,local_90);
  anon_unknown_0::Output
            (
            "Case 2: <index> is greater than the number of the active resources in GetProgramResourceName\n"
            );
  glu::CallLogWrapper::glGetProgramResourceName
            (pCVar3,local_90,0x92e3,3000,0x400,(GLsizei *)(name + 0x60),(GLchar *)&program);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xc]
  )();
  anon_unknown_0::Output("Case 2 finished\n");
  anon_unknown_0::Output("Case 3: <propCount> is zero in GetProgramResourceiv\n");
  glu::CallLogWrapper::glGetProgramResourceiv
            (pCVar3,local_90,0x92e3,0,0,&local_8c,0x400,(GLsizei *)(name + 0x60),&local_1c);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xc]
  )(this,0x501,&len);
  anon_unknown_0::Output("Case 3 finished\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&prop,"position",&local_101);
  std::allocator<char>::~allocator(&local_101);
  GVar2 = local_90;
  name_00 = (GLchar *)std::__cxx11::string::c_str();
  glu::CallLogWrapper::glGetProgramResourceName
            (&(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,GVar2,0x92e3,0,-100,(GLsizei *)0x0,name_00);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xc]
  )(this,0x501,&len);
  local_108 = 0x92f9;
  glu::CallLogWrapper::glGetProgramResourceiv
            (&(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,local_90,0x92e3,0,1,&local_108,-100,(GLsizei *)(name + 0x60),
             &local_1c);
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0xc]
  )(this,0x501,&len);
  glu::CallLogWrapper::glDeleteProgram
            (&(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,local_90);
  lVar1 = _len;
  std::__cxx11::string::~string((string *)&prop);
  return lVar1;
}

Assistant:

virtual long Run()
	{
		long error = NO_ERROR;

		GLint   res;
		GLsizei len		  = 0;
		GLchar  name[100] = { '\0' };
		GLenum  props[1]  = { GL_NAME_LENGTH };

		Output("Case 1: <program> not a name of shader/program object\n");
		glGetProgramInterfaceiv(1337u, GL_PROGRAM_INPUT, GL_ACTIVE_RESOURCES, &res);
		ExpectError(GL_INVALID_VALUE, error);
		glGetProgramResourceIndex(31337u, GL_PROGRAM_INPUT, "pie");
		ExpectError(GL_INVALID_VALUE, error);
		glGetProgramResourceName(1337u, GL_PROGRAM_INPUT, 0, 1024, &len, name);
		ExpectError(GL_INVALID_VALUE, error);
		glGetProgramResourceiv(1337u, GL_PROGRAM_INPUT, 0, 1, props, 1024, &len, &res);
		ExpectError(GL_INVALID_VALUE, error);
		glGetProgramResourceLocation(1337u, GL_PROGRAM_INPUT, "pie");
		ExpectError(GL_INVALID_VALUE, error);
		Output("Case 1 finished\n");

		GLuint program = CreateProgram(VertexShader().c_str(), FragmentShader().c_str(), false);
		glBindAttribLocation(program, 0, "position");
		LinkProgram(program);

		Output("Case 2: <index> is greater than the number of the active resources in GetProgramResourceName\n");
		glGetProgramResourceName(program, GL_PROGRAM_INPUT, 3000, 1024, &len, name);
		ExpectError(GL_INVALID_VALUE, error);
		Output("Case 2 finished\n");

		Output("Case 3: <propCount> is zero in GetProgramResourceiv\n");
		glGetProgramResourceiv(program, GL_PROGRAM_INPUT, 0, 0, props, 1024, &len, &res);
		ExpectError(GL_INVALID_VALUE, error);
		Output("Case 3 finished\n");

		std::string str = "position";
		glGetProgramResourceName(program, GL_PROGRAM_INPUT, 0, -100, NULL, const_cast<char*>(str.c_str()));
		ExpectError(GL_INVALID_VALUE, error);
		GLenum prop = GL_NAME_LENGTH;
		glGetProgramResourceiv(program, GL_PROGRAM_INPUT, 0, 1, &prop, -100, &len, &res);
		ExpectError(GL_INVALID_VALUE, error);

		glDeleteProgram(program);
		return error;
	}